

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerHLSL::emit_builtin_primitive_outputs_in_struct(CompilerHLSL *this)

{
  size_t count;
  uint *puVar1;
  __node_base *p_Var2;
  long lVar3;
  uint32_t i;
  ulong uVar4;
  long lVar5;
  anon_class_8_1_8991fb9c local_60;
  SmallVector<unsigned_int,_8UL> local_58;
  
  local_60.this = this;
  for (uVar4 = 0; uVar4 != 0x40; uVar4 = uVar4 + 1) {
    if (((this->super_CompilerGLSL).super_Compiler.active_output_builtins.lower >> (uVar4 & 0x3f) &
        1) != 0) {
      emit_builtin_primitive_outputs_in_struct::anon_class_8_1_8991fb9c::operator()
                (&local_60,(uint32_t)uVar4);
    }
  }
  count = (this->super_CompilerGLSL).super_Compiler.active_output_builtins.higher._M_h.
          _M_element_count;
  if (count != 0) {
    local_58.super_VectorView<unsigned_int>.ptr = (uint *)&local_58.stack_storage;
    local_58.super_VectorView<unsigned_int>.buffer_size = 0;
    local_58.buffer_capacity = 8;
    SmallVector<unsigned_int,_8UL>::reserve(&local_58,count);
    p_Var2 = &(this->super_CompilerGLSL).super_Compiler.active_output_builtins.higher._M_h.
              _M_before_begin;
    while (p_Var2 = p_Var2->_M_nxt, p_Var2 != (__node_base *)0x0) {
      SmallVector<unsigned_int,_8UL>::push_back(&local_58,(uint *)(p_Var2 + 1));
    }
    ::std::__sort<unsigned_int*,__gnu_cxx::__ops::_Iter_less_iter>
              (local_58.super_VectorView<unsigned_int>.ptr,
               (char *)local_58.super_VectorView<unsigned_int>.ptr +
               local_58.super_VectorView<unsigned_int>.buffer_size * 4);
    puVar1 = local_58.super_VectorView<unsigned_int>.ptr;
    lVar5 = local_58.super_VectorView<unsigned_int>.buffer_size << 2;
    for (lVar3 = 0; lVar5 != lVar3; lVar3 = lVar3 + 4) {
      emit_builtin_primitive_outputs_in_struct::anon_class_8_1_8991fb9c::operator()
                (&local_60,*(uint32_t *)((char *)puVar1 + lVar3));
    }
    SmallVector<unsigned_int,_8UL>::~SmallVector(&local_58);
  }
  return;
}

Assistant:

void CompilerHLSL::emit_builtin_primitive_outputs_in_struct()
{
	active_output_builtins.for_each_bit([&](uint32_t i) {
		const char *type = nullptr;
		const char *semantic = nullptr;
		auto builtin = static_cast<BuiltIn>(i);
		switch (builtin)
		{
		case BuiltInLayer:
		{
			if (hlsl_options.shader_model < 50)
				SPIRV_CROSS_THROW("Render target array index output is only supported in SM 5.0 or higher.");
			type = "uint";
			semantic = "SV_RenderTargetArrayIndex";
			break;
		}

		case BuiltInPrimitiveId:
			type = "uint";
			semantic = "SV_PrimitiveID";
			break;

		case BuiltInViewportIndex:
			type = "uint";
			semantic = "SV_ViewportArrayIndex";
			break;

		case BuiltInPrimitiveShadingRateKHR:
			type = "uint";
			semantic = "SV_ShadingRate";
			break;

		case BuiltInCullPrimitiveEXT:
			type = "bool";
			semantic = "SV_CullPrimitive";
			break;

		default:
			break;
		}

		if (type && semantic)
			statement(type, " ", builtin_to_glsl(builtin, StorageClassOutput), " : ", semantic, ";");
	});
}